

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lratchecker.cpp
# Opt level: O0

void __thiscall CaDiCaL::LratChecker::~LratChecker(LratChecker *this)

{
  LratCheckerClause *in_RDI;
  LratCheckerClause *next_1;
  LratCheckerClause *c_1;
  LratCheckerClause *next;
  LratCheckerClause *c;
  size_t i;
  LratChecker *in_stack_ffffffffffffffd0;
  LratChecker *local_28;
  undefined8 *local_18;
  ulong local_10;
  
  in_RDI->next = (LratCheckerClause *)&PTR__LratChecker_0132a8e8;
  for (local_10 = 0; local_10 < in_RDI[5].id; local_10 = local_10 + 1) {
    local_18 = *(undefined8 **)(*(long *)&in_RDI[5].garbage + local_10 * 8);
    while (local_18 != (undefined8 *)0x0) {
      local_18 = (undefined8 *)*local_18;
      delete_clause(in_stack_ffffffffffffffd0,in_RDI);
    }
  }
  local_28 = *(LratChecker **)&in_RDI[5].used;
  while (local_28 != (LratChecker *)0x0) {
    in_stack_ffffffffffffffd0 =
         (LratChecker *)(local_28->super_StatTracer).super_InternalTracer.super_Tracer._vptr_Tracer;
    delete_clause(in_stack_ffffffffffffffd0,in_RDI);
    local_28 = in_stack_ffffffffffffffd0;
  }
  if (*(void **)&in_RDI[5].garbage != (void *)0x0) {
    operator_delete__(*(void **)&in_RDI[5].garbage);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffffd0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffd0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffd0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffd0);
  std::
  unordered_map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~unordered_map((unordered_map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>
                    *)0xdca561);
  std::vector<signed_char,_std::allocator<signed_char>_>::~vector
            ((vector<signed_char,_std::allocator<signed_char>_> *)in_stack_ffffffffffffffd0);
  std::vector<signed_char,_std::allocator<signed_char>_>::~vector
            ((vector<signed_char,_std::allocator<signed_char>_> *)in_stack_ffffffffffffffd0);
  StatTracer::~StatTracer((StatTracer *)0xdca587);
  return;
}

Assistant:

LratChecker::~LratChecker () {
  LOG ("LRAT CHECKER delete");
  for (size_t i = 0; i < size_clauses; i++)
    for (LratCheckerClause *c = clauses[i], *next; c; c = next)
      next = c->next, delete_clause (c);
  for (LratCheckerClause *c = garbage, *next; c; c = next)
    next = c->next, delete_clause (c);
  delete[] clauses;
}